

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  int iVar4;
  size_t sVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  size_t err_code;
  undefined1 auVar7 [16];
  
  sVar5 = ZSTD_buildSeqStore(zc,src,srcSize);
  iVar4 = 1;
  if (sVar5 < 0xffffffffffffff89) {
    iVar4 = (uint)(sVar5 == 1) << 2;
  }
  if (iVar4 == 4) {
    sVar5 = 0;
  }
  else {
    if (iVar4 != 0) {
      return sVar5;
    }
    if ((zc->seqCollector).collectSequences != 0) {
      ZSTD_copyBlockSequences(zc);
      uVar1 = (zc->blockState).prevCBlock;
      uVar2 = (zc->blockState).nextCBlock;
      auVar7._8_4_ = (int)uVar1;
      auVar7._0_8_ = uVar2;
      auVar7._12_4_ = (int)((ulong)uVar1 >> 0x20);
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar2;
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar7._8_8_;
      return 0;
    }
    sVar5 = ZSTD_entropyCompressSeqStore
                      (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                       &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,dst,dstCapacity,
                       srcSize,zc->entropyWorkspace,(ulong)(uint)zc->bmi2,1);
    if ((((frame == 0) || (zc->isFirstBlock != 0)) || (0x18 < sVar5)) ||
       (iVar4 = ZSTD_isRLE((BYTE *)src,srcSize), iVar4 == 0)) {
      if (sVar5 - 2 < 0xffffffffffffff87) {
        pZVar3 = (zc->blockState).prevCBlock;
        pZVar6 = (zc->blockState).nextCBlock;
        (zc->blockState).prevCBlock = pZVar6;
        (zc->blockState).nextCBlock = pZVar3;
        goto LAB_001b8864;
      }
    }
    else {
      *(undefined1 *)dst = *src;
      sVar5 = 1;
    }
  }
  pZVar6 = (zc->blockState).prevCBlock;
LAB_001b8864:
  if ((pZVar6->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar6->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return sVar5;
}

Assistant:

static size_t
ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                            void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize, U32 frame)
{
    /* This is an estimated upper bound for the length of an rle block.
     * This isn't the actual upper bound.
     * Finding the real threshold needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) { cSize = 0; goto out; }
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}